

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Expressions.h
# Opt level: O0

void __thiscall
psy::C::ConditionalExpressionSyntax::~ConditionalExpressionSyntax(ConditionalExpressionSyntax *this)

{
  void *in_RSI;
  ConditionalExpressionSyntax *this_local;
  
  ~ConditionalExpressionSyntax(this);
  Managed::operator_delete((Managed *)this,in_RSI);
  return;
}

Assistant:

class PSY_C_API ConditionalExpressionSyntax : public ExpressionSyntax
{
    AST_NODE_1K(ConditionalExpression, Expression)

public:
    const ExpressionSyntax* condition() const { return condExpr_; }
    SyntaxToken questionToken() const { return tokenAtIndex(questionTkIdx_); }
    const ExpressionSyntax* whenTrue() const { return whenTrueExpr_; }
    SyntaxToken colonToken() const { return tokenAtIndex(colonTkIdx_); }
    const ExpressionSyntax* whenFalse() const { return whenFalseExpr_; }

private:
    ExpressionSyntax* condExpr_ = nullptr;
    LexedTokens::IndexType questionTkIdx_ = LexedTokens::invalidIndex();
    ExpressionSyntax* whenTrueExpr_ = nullptr;
    LexedTokens::IndexType colonTkIdx_ = LexedTokens::invalidIndex();
    ExpressionSyntax* whenFalseExpr_ = nullptr;
    AST_CHILD_LST5(condExpr_, questionTkIdx_, whenTrueExpr_, colonTkIdx_, whenFalseExpr_);
}